

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PragmaExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == NameValuePragmaExpression) || (kind == NumberPragmaExpression)) ||
      (kind == ParenPragmaExpression)) || (kind == SimplePragmaExpression)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PragmaExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NameValuePragmaExpression:
        case SyntaxKind::NumberPragmaExpression:
        case SyntaxKind::ParenPragmaExpression:
        case SyntaxKind::SimplePragmaExpression:
            return true;
        default:
            return false;
    }
}